

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AppendToken(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
              *this,Ch *str,SizeType len)

{
  char cVar1;
  char *pcVar2;
  uint local_20;
  SizeType i;
  SizeType len_local;
  Ch *str_local;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  internal::Stack<rapidjson::CrtAllocator>::Reserve<char>
            (&this->documentStack_,(ulong)(len * 2 + 1));
  pcVar2 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(&this->documentStack_,1);
  *pcVar2 = '/';
  for (local_20 = 0; local_20 < len; local_20 = local_20 + 1) {
    if (str[local_20] == '~') {
      pcVar2 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(&this->documentStack_,1);
      *pcVar2 = '~';
      pcVar2 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(&this->documentStack_,1);
      *pcVar2 = '0';
    }
    else if (str[local_20] == '/') {
      pcVar2 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(&this->documentStack_,1);
      *pcVar2 = '~';
      pcVar2 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(&this->documentStack_,1);
      *pcVar2 = '1';
    }
    else {
      cVar1 = str[local_20];
      pcVar2 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(&this->documentStack_,1);
      *pcVar2 = cVar1;
    }
  }
  return;
}

Assistant:

void AppendToken(const Ch* str, SizeType len) {
        documentStack_.template Reserve<Ch>(1 + len * 2); // worst case all characters are escaped as two characters
        *documentStack_.template PushUnsafe<Ch>() = '/';
        for (SizeType i = 0; i < len; i++) {
            if (str[i] == '~') {
                *documentStack_.template PushUnsafe<Ch>() = '~';
                *documentStack_.template PushUnsafe<Ch>() = '0';
            }
            else if (str[i] == '/') {
                *documentStack_.template PushUnsafe<Ch>() = '~';
                *documentStack_.template PushUnsafe<Ch>() = '1';
            }
            else
                *documentStack_.template PushUnsafe<Ch>() = str[i];
        }
    }